

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_symbol.hpp
# Opt level: O3

rt_expression_interface<double> * __thiscall
viennamath::rt_function_symbol<viennamath::rt_expression_interface<double>_>::diff
          (rt_function_symbol<viennamath::rt_expression_interface<double>_> *this,
          rt_expression_interface<double> *diff_var)

{
  long lVar1;
  rt_expression_interface<double> *prVar2;
  expression_not_differentiable_exception *this_00;
  _func_int **pp_Var3;
  string local_40;
  
  if (diff_var != (rt_expression_interface<double> *)0x0) {
    lVar1 = __dynamic_cast(diff_var,&rt_expression_interface<double>::typeinfo,
                           &rt_function_symbol<viennamath::rt_expression_interface<double>>::
                            typeinfo,0);
    if (lVar1 != 0) {
      if ((*(id_type *)(lVar1 + 8) == this->id_) && (*(id_type *)(lVar1 + 0x10) == this->tag_id_)) {
        pp_Var3 = (_func_int **)0x3ff0000000000000;
      }
      else {
        pp_Var3 = (_func_int **)0x0;
      }
      prVar2 = (rt_expression_interface<double> *)operator_new(0x10);
      prVar2->_vptr_rt_expression_interface = (_func_int **)&PTR__rt_expression_interface_00125da0;
      prVar2[1]._vptr_rt_expression_interface = pp_Var3;
      return prVar2;
    }
  }
  this_00 = (expression_not_differentiable_exception *)__cxa_allocate_exception(0x28);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Cannot differentiate rt_function_symbol!","");
  expression_not_differentiable_exception::expression_not_differentiable_exception
            (this_00,&local_40);
  __cxa_throw(this_00,&expression_not_differentiable_exception::typeinfo,
              expression_not_differentiable_exception::~expression_not_differentiable_exception);
}

Assistant:

InterfaceType * diff(const InterfaceType * diff_var) const
      {
        const self_type * ptr = dynamic_cast< const self_type *>(diff_var);
        if (ptr != NULL)
        {
          //std::cout << "diff variable<" << id << ">: TRUE" << std::endl;
          if (ptr->id() == id_ && ptr->tag_id() == tag_id_)
            return new rt_constant<numeric_type, InterfaceType>(1);
          else
            //std::cout << "diff variable<" << id << ">: FALSE, is: " << diff_var.get()->str() << std::endl;
            return new rt_constant<numeric_type, InterfaceType>(0);
        }

        // the derivative of a function symbol with respect to a variable should not be triggered here. TODO: Maybe move higher-level code here?
        throw expression_not_differentiable_exception("Cannot differentiate rt_function_symbol!");
        return NULL;
      }